

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variables.cpp
# Opt level: O2

bool __thiscall Refal2::CVariablesBuilder::checkName(CVariablesBuilder *this,TVariableName name)

{
  int iVar1;
  int iVar2;
  undefined7 in_register_00000031;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  iVar2 = (int)CONCAT71(in_register_00000031,name);
  iVar1 = isalnum(iVar2);
  if (iVar2 != 0x5f && iVar1 == 0) {
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_80,'\x01');
    std::operator+(&local_60,"invalid variable name `",&local_80);
    std::operator+(&local_40,&local_60,"`, only letter, digit or `_` allowed as variable name");
    error(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
  }
  return iVar2 == 0x5f || iVar1 != 0;
}

Assistant:

bool CVariablesBuilder::checkName( const TVariableName name )
{
	if( ::isalnum( name ) != 0 || name == '_' ) {
		return true;
	}
	error( "invalid variable name `"
		+ std::string( 1, static_cast<char>( name ) )
		+ "`, only letter, digit or `_` allowed as variable name" );
	return false;
}